

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledGetSuperProperty<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  uchar localRegisterID;
  ushort uVar1;
  FunctionBody *functionBody;
  PropertyId propertyId;
  Var pvVar2;
  InlineCache *inlineCache;
  Var thisInstance;
  
  localRegisterID = playout->Value;
  pvVar2 = GetReg<unsigned_char>(this,playout->Instance);
  propertyId = GetPropertyIdFromCacheId(this,(uint)playout->PropertyIdIndex);
  inlineCache = GetInlineCache(this,(uint)playout->PropertyIdIndex);
  uVar1 = playout->PropertyIdIndex;
  functionBody = *(FunctionBody **)(this + 0x88);
  thisInstance = GetReg<unsigned_char>(this,playout->Value2);
  pvVar2 = ProfilingHelpers::ProfiledLdFld<false,false,false>
                     (pvVar2,propertyId,inlineCache,(uint)uVar1,functionBody,thisInstance);
  SetReg<unsigned_char>(this,localRegisterID,pvVar2);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfiledGetSuperProperty(unaligned T* playout)
    {
        SetReg(
            playout->Value,
            ProfilingHelpers::ProfiledLdFld<false, false, false>(
                GetReg(playout->Instance),
                GetPropertyIdFromCacheId(playout->PropertyIdIndex),
                GetInlineCache(playout->PropertyIdIndex),
                playout->PropertyIdIndex,
                GetFunctionBody(),
                GetReg(playout->Value2)));

    }